

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.c
# Opt level: O2

int init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  uint *puVar4;
  undefined1 local_76 [17];
  undefined4 uStack_65;
  
  if (gPropFd != -1) {
    __assert_fail("gPropFd == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kiddlu[P]android-init-for-linux/libprop/properties.c"
                  ,0x51,"void init(void)");
  }
  iVar1 = socket(1,1,0);
  if (iVar1 < 0) {
    puVar4 = (uint *)__errno_location();
    iVar1 = printf("UNIX domain socket create failed (errno=%d)\n",(ulong)*puVar4);
  }
  else {
    local_76[2] = '/';
    local_76[3] = 't';
    local_76[4] = 'm';
    local_76[5] = 'p';
    local_76[6] = '/';
    local_76[7] = 'l';
    local_76[8] = 'i';
    local_76[9] = 'n';
    local_76._10_7_ = 0x707379732d7875;
    uStack_65 = 0x706f72;
    local_76._0_2_ = 1;
    sVar3 = strlen(local_76 + 2);
    iVar2 = connect(iVar1,(sockaddr *)local_76,(int)sVar3 + 2);
    if (-1 < iVar2) {
      gPropFd = iVar1;
      return iVar2;
    }
    iVar1 = close(iVar1);
  }
  gPropFd = -1;
  return iVar1;
}

Assistant:

static void init(void)
{
    assert(gPropFd == -1);

    gPropFd = connectToServer(SYSTEM_PROPERTY_PIPE_NAME);
    if (gPropFd < 0) {
        //LOGW("not connected to system property server\n");
    } else {
        //LOGV("Connected to system property server\n");
    }
}